

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ErrorCheckEndFrameRecover(ImGuiErrorLogCallback log_callback,void *user_data)

{
  ImGuiContext *pIVar1;
  ImGuiColorMod *pIVar2;
  char *pcVar3;
  undefined8 in_RSI;
  code *in_RDI;
  ImGuiWindow *window;
  ImGuiContext *g;
  char *in_stack_ffffffffffffffd0;
  ImGuiWindow *pIVar4;
  
  pIVar1 = GImGui;
  while( true ) {
    if ((pIVar1->CurrentWindowStack).Size < 1) {
      return;
    }
    pIVar4 = pIVar1->CurrentWindow;
    while (pIVar1->CurrentTabBar != (ImGuiTabBar *)0x0) {
      if (in_RDI != (code *)0x0) {
        (*in_RDI)(in_RSI,"Recovered from missing EndTabBar() in \'%s\'",pIVar4->Name);
      }
      EndTabBar();
    }
    while (0 < (pIVar1->CurrentWindow->DC).TreeDepth) {
      if (in_RDI != (code *)0x0) {
        (*in_RDI)(in_RSI,"Recovered from missing TreePop() in \'%s\'",pIVar4->Name);
      }
      TreePop();
    }
    while ((int)(pIVar1->CurrentWindow->DC).StackSizesOnBegin.SizeOfGroupStack <
           (pIVar1->GroupStack).Size) {
      if (in_RDI != (code *)0x0) {
        (*in_RDI)(in_RSI,"Recovered from missing EndGroup() in \'%s\'",pIVar4->Name);
      }
      EndGroup();
    }
    while (1 < (pIVar1->CurrentWindow->IDStack).Size) {
      if (in_RDI != (code *)0x0) {
        (*in_RDI)(in_RSI,"Recovered from missing PopID() in \'%s\'",pIVar4->Name);
      }
      PopID();
    }
    while ((int)(pIVar1->CurrentWindow->DC).StackSizesOnBegin.SizeOfColorStack <
           (pIVar1->ColorStack).Size) {
      if (in_RDI != (code *)0x0) {
        in_stack_ffffffffffffffd0 = pIVar4->Name;
        pIVar2 = ImVector<ImGuiColorMod>::back(&pIVar1->ColorStack);
        pcVar3 = GetStyleColorName(pIVar2->Col);
        (*in_RDI)(in_RSI,"Recovered from missing PopStyleColor() in \'%s\' for ImGuiCol_%s",
                  in_stack_ffffffffffffffd0,pcVar3);
      }
      PopStyleColor((int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    }
    while ((int)(pIVar1->CurrentWindow->DC).StackSizesOnBegin.SizeOfStyleVarStack <
           (pIVar1->StyleVarStack).Size) {
      if (in_RDI != (code *)0x0) {
        (*in_RDI)(in_RSI,"Recovered from missing PopStyleVar() in \'%s\'",pIVar4->Name);
      }
      PopStyleVar((int)((ulong)pIVar4 >> 0x20));
    }
    while ((int)(pIVar1->CurrentWindow->DC).StackSizesOnBegin.SizeOfFocusScopeStack <
           (pIVar1->FocusScopeStack).Size) {
      if (in_RDI != (code *)0x0) {
        (*in_RDI)(in_RSI,"Recovered from missing PopFocusScope() in \'%s\'",pIVar4->Name);
      }
      PopFocusScope();
    }
    if ((pIVar1->CurrentWindowStack).Size == 1) break;
    if ((pIVar1->CurrentWindow->Flags & 0x1000000U) == 0) {
      if (in_RDI != (code *)0x0) {
        (*in_RDI)(in_RSI,"Recovered from missing End() for \'%s\'",pIVar4->Name);
      }
      End();
    }
    else {
      if (in_RDI != (code *)0x0) {
        (*in_RDI)(in_RSI,"Recovered from missing EndChild() for \'%s\'",pIVar4->Name);
      }
      EndChild();
    }
  }
  return;
}

Assistant:

void    ImGui::ErrorCheckEndFrameRecover(ImGuiErrorLogCallback log_callback, void* user_data)
{
    // PVS-Studio V1044 is "Loop break conditions do not depend on the number of iterations"
    ImGuiContext& g = *GImGui;
    while (g.CurrentWindowStack.Size > 0)
    {
#ifdef IMGUI_HAS_TABLE
        while (g.CurrentTable && (g.CurrentTable->OuterWindow == g.CurrentWindow || g.CurrentTable->InnerWindow == g.CurrentWindow))
        {
            if (log_callback) log_callback(user_data, "Recovered from missing EndTable() in '%s'", g.CurrentTable->OuterWindow->Name);
            EndTable();
        }
#endif
        ImGuiWindow* window = g.CurrentWindow;
        while (g.CurrentTabBar != NULL) //-V1044
        {
            if (log_callback) log_callback(user_data, "Recovered from missing EndTabBar() in '%s'", window->Name);
            EndTabBar();
        }
        while (g.CurrentWindow->DC.TreeDepth > 0) //-V1044
        {
            if (log_callback) log_callback(user_data, "Recovered from missing TreePop() in '%s'", window->Name);
            TreePop();
        }
        while (g.GroupStack.Size > g.CurrentWindow->DC.StackSizesOnBegin.SizeOfGroupStack) //-V1044
        {
            if (log_callback) log_callback(user_data, "Recovered from missing EndGroup() in '%s'", window->Name);
            EndGroup();
        }
        while (g.CurrentWindow->IDStack.Size > 1) //-V1044
        {
            if (log_callback) log_callback(user_data, "Recovered from missing PopID() in '%s'", window->Name);
            PopID();
        }
        while (g.ColorStack.Size > g.CurrentWindow->DC.StackSizesOnBegin.SizeOfColorStack) //-V1044
        {
            if (log_callback) log_callback(user_data, "Recovered from missing PopStyleColor() in '%s' for ImGuiCol_%s", window->Name, GetStyleColorName(g.ColorStack.back().Col));
            PopStyleColor();
        }
        while (g.StyleVarStack.Size > g.CurrentWindow->DC.StackSizesOnBegin.SizeOfStyleVarStack) //-V1044
        {
            if (log_callback) log_callback(user_data, "Recovered from missing PopStyleVar() in '%s'", window->Name);
            PopStyleVar();
        }
        while (g.FocusScopeStack.Size > g.CurrentWindow->DC.StackSizesOnBegin.SizeOfFocusScopeStack) //-V1044
        {
            if (log_callback) log_callback(user_data, "Recovered from missing PopFocusScope() in '%s'", window->Name);
            PopFocusScope();
        }
        if (g.CurrentWindowStack.Size == 1)
        {
            IM_ASSERT(g.CurrentWindow->IsFallbackWindow);
            break;
        }
        if (g.CurrentWindow->Flags & ImGuiWindowFlags_ChildWindow)
        {
            if (log_callback) log_callback(user_data, "Recovered from missing EndChild() for '%s'", window->Name);
            EndChild();
        }
        else
        {
            if (log_callback) log_callback(user_data, "Recovered from missing End() for '%s'", window->Name);
            End();
        }
    }
}